

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O1

Var Js::JavascriptMath::MulAddLeft
              (Var mulLeft,Var mulRight,Var addLeft,ScriptContext *scriptContext,
              JavascriptNumber *result)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint64 uVar4;
  Var pvVar5;
  JavascriptNumber JVar6;
  double dVar7;
  ulong uVar8;
  double dVar9;
  JavascriptNumber local_60;
  JavascriptNumber mulTemp;
  int local_40;
  
  if (((ulong)mulLeft & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)mulLeft & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00aab360;
    *puVar3 = 0;
  }
  uVar8 = (ulong)mulRight & 0xffff000000000000;
  bVar2 = ((ulong)mulRight & 0x1ffff00000000) != 0x1000000000000;
  if (((ulong)mulLeft & 0xffff000000000000) == 0x1000000000000) {
    if (bVar2 && uVar8 == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00aab360;
      *puVar3 = 0;
    }
    if (uVar8 == 0x1000000000000) {
      bVar2 = NumberUtilities::IsNan(0.0);
      if (((bVar2) && (uVar4 = NumberUtilities::ToSpecial(0.0), uVar4 != 0xfff8000000000000)) &&
         (uVar4 = NumberUtilities::ToSpecial(0.0), uVar4 != 0x7ff8000000000000)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                    ,0x11,
                                    "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                    ,"We should only produce a NaN with this value");
        if (!bVar2) goto LAB_00aab360;
        *puVar3 = 0;
      }
      uVar4 = NumberUtilities::ToSpecial(0.0);
      local_60.m_value = (double)(uVar4 ^ 0xfffc000000000000);
      pvVar5 = TaggedInt::MultiplyInPlace(mulLeft,mulRight,scriptContext,&local_60);
      goto joined_r0x00aab2e1;
    }
    if ((ulong)mulRight >> 0x32 == 0) goto LAB_00aab20f;
    if (((ulong)addLeft & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)addLeft & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00aab360;
      *puVar3 = 0;
    }
    dVar9 = (double)((ulong)mulRight ^ 0xfffc000000000000) * (double)(int)mulLeft;
    if (((ulong)addLeft & 0xffff000000000000) == 0x1000000000000) goto LAB_00aab1f8;
    if (addLeft < (Var)0x4000000000000) goto LAB_00aab33f;
    dVar7 = (double)((ulong)addLeft ^ 0xfffc000000000000);
LAB_00aab1ff:
    dVar9 = dVar9 + dVar7;
LAB_00aab302:
    pvVar5 = JavascriptNumber::ToVarMaybeInPlace(dVar9,scriptContext,result);
    return pvVar5;
  }
  if (bVar2 && uVar8 == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00aab360;
    *puVar3 = 0;
  }
  if (uVar8 == 0x1000000000000) {
    if ((Var)0x3ffffffffffff < mulLeft) {
      JVar6.m_value = (double)((ulong)addLeft & 0xffff000000000000);
      if (((ulong)addLeft & 0x1ffff00000000) != 0x1000000000000 &&
          JVar6.m_value == 1.390671161567e-309) {
        AssertCount = AssertCount + 1;
        mulTemp.m_value = JVar6.m_value;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar2) goto LAB_00aab360;
        *puVar3 = 0;
        JVar6 = mulTemp;
      }
      local_40 = (int)mulRight;
      dVar9 = (double)local_40;
LAB_00aab1eb:
      dVar9 = dVar9 * (double)((ulong)mulLeft ^ 0xfffc000000000000);
      if (JVar6.m_value != 1.390671161567e-309) {
        if (addLeft < (Var)0x4000000000000) {
LAB_00aab33f:
          pvVar5 = JavascriptNumber::ToVarMaybeInPlace(dVar9,scriptContext,result);
          pvVar5 = Add_Full(addLeft,pvVar5,scriptContext);
          return pvVar5;
        }
        dVar9 = dVar9 + (double)((ulong)addLeft ^ 0xfffc000000000000);
        goto LAB_00aab302;
      }
LAB_00aab1f8:
      dVar7 = (double)(int)addLeft;
      goto LAB_00aab1ff;
    }
  }
  else if ((Var)0x3ffffffffffff < mulRight && (Var)0x3ffffffffffff < mulLeft) {
    JVar6.m_value = (double)((ulong)addLeft & 0xffff000000000000);
    if (((ulong)addLeft & 0x1ffff00000000) != 0x1000000000000 &&
        JVar6.m_value == 1.390671161567e-309) {
      AssertCount = AssertCount + 1;
      mulTemp.m_value = JVar6.m_value;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00aab360;
      *puVar3 = 0;
      JVar6 = mulTemp;
    }
    dVar9 = (double)((ulong)mulRight ^ 0xfffc000000000000);
    goto LAB_00aab1eb;
  }
LAB_00aab20f:
  bVar2 = NumberUtilities::IsNan(0.0);
  if (((bVar2) && (uVar4 = NumberUtilities::ToSpecial(0.0), uVar4 != 0xfff8000000000000)) &&
     (uVar4 = NumberUtilities::ToSpecial(0.0), uVar4 != 0x7ff8000000000000)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                ,0x11,
                                "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                ,"We should only produce a NaN with this value");
    if (!bVar2) {
LAB_00aab360:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  uVar4 = NumberUtilities::ToSpecial(0.0);
  local_60.m_value = (double)(uVar4 ^ 0xfffc000000000000);
  pvVar5 = Multiply_InPlace(mulLeft,mulRight,scriptContext,&local_60);
joined_r0x00aab2e1:
  if (result == (JavascriptNumber *)0x0) {
    pvVar5 = Add_Full(addLeft,pvVar5,scriptContext);
  }
  else {
    pvVar5 = Add_InPlace(addLeft,pvVar5,scriptContext,result);
  }
  return pvVar5;
}

Assistant:

Var JavascriptMath::MulAddLeft(Var mulLeft, Var mulRight, Var addLeft, ScriptContext* scriptContext,  JavascriptNumber* result)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_MulAddLeft);
            if(TaggedInt::Is(mulLeft))
            {
                if(TaggedInt::Is(mulRight))
                {
                    // Compute the sum using integer addition, then convert to double.
                    // That way there's only one int->float conversion.
                    JavascriptNumber mulTemp(0, scriptContext->GetLibrary()->GetNumberTypeStatic());
                    Var mulResult = TaggedInt::MultiplyInPlace(mulLeft, mulRight, scriptContext, &mulTemp);

                    if (result)
                    {
                        return JavascriptMath::Add_InPlace(addLeft, mulResult, scriptContext, result);
                    }
                    else
                    {
                        return JavascriptMath::Add_Full(addLeft, mulResult, scriptContext);
                    }
                }
                else if(JavascriptNumber::Is_NoTaggedIntCheck(mulRight))
                {
                    double mulResult = TaggedInt::ToDouble(mulLeft) * JavascriptNumber::GetValue(mulRight);

                    return JavascriptMath::Add_DoubleHelper(addLeft, mulResult, scriptContext, result);
                }
            }
            else if(TaggedInt::Is(mulRight))
            {
                if(JavascriptNumber::Is_NoTaggedIntCheck(mulLeft))
                {
                    double mulResult = JavascriptNumber::GetValue(mulLeft) * TaggedInt::ToDouble(mulRight);

                    return JavascriptMath::Add_DoubleHelper(addLeft, mulResult, scriptContext, result);
                }
            }
            else if(JavascriptNumber::Is_NoTaggedIntCheck(mulLeft) && JavascriptNumber::Is_NoTaggedIntCheck(mulRight))
            {
                double mulResult = JavascriptNumber::GetValue(mulLeft) * JavascriptNumber::GetValue(mulRight);

                return JavascriptMath::Add_DoubleHelper(addLeft, mulResult, scriptContext, result);
            }

            Var aMul;
            JavascriptNumber mulTemp(0, scriptContext->GetLibrary()->GetNumberTypeStatic());
            aMul = JavascriptMath::Multiply_InPlace(mulLeft, mulRight, scriptContext, &mulTemp);
            if (result)
            {
                return JavascriptMath::Add_InPlace(addLeft, aMul, scriptContext, result);
            }
            else
            {
                return JavascriptMath::Add_Full(addLeft, aMul, scriptContext);
            }
            JIT_HELPER_END(Op_MulAddLeft);
        }